

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_descriptor.cpp
# Opt level: O0

string * __thiscall
program_options::option_description::format_name_abi_cxx11_(option_description *this)

{
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  string *__s;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  allocator<char> local_69;
  string local_68 [32];
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48 [3];
  string local_30 [48];
  
  __s = in_RDI;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(in_stack_ffffffffffffff50);
    if (bVar1) {
      std::__cxx11::string::string((string *)in_RDI,(string *)in_RSI);
    }
    else {
      std::__cxx11::string::string(local_30,(string *)in_RSI);
      psVar3 = (string *)std::__cxx11::string::append((char *)local_30);
      local_48[0]._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(in_stack_ffffffffffffff38);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(local_48);
      pcVar4 = (char *)std::__cxx11::string::append(psVar3);
      psVar3 = (string *)std::__cxx11::string::append(pcVar4);
      std::__cxx11::string::string((string *)in_RDI,psVar3);
      std::__cxx11::string::~string(local_30);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RSI,(char *)__s,(allocator<char> *)in_RDI)
    ;
    local_78._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_ffffffffffffff38);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_78);
    psVar3 = (string *)std::__cxx11::string::append(local_68);
    std::__cxx11::string::string((string *)in_RDI,psVar3);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  return __s;
}

Assistant:

std::string option_description::format_name() const
{
    if (!m_short_name.empty())
    {
        if (m_long_names.empty()) {
            return m_short_name;
        } else {
            return std::string(m_short_name)
                    .append(" [ --")
                    .append(*m_long_names.begin())
                    .append(" ]");
        }
    }
    return std::string("--").append(*m_long_names.begin());
}